

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_dict_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sStack_a0;
  Byte *local_90;
  undefined4 local_88;
  Byte *local_78;
  undefined4 local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  uLong local_30;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_40 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_88 = (undefined4)comprLen;
  local_90 = compr;
  uVar1 = inflateInit_(&local_90,"1.2.11",0x70);
  if (uVar1 == 0) {
    local_70 = (undefined4)uncomprLen;
    local_78 = uncompr;
    do {
      uVar1 = inflate(&local_90,0);
      if (uVar1 == 2) {
        if (local_30 == dictId) {
          uVar1 = inflateSetDictionary(&local_90,"hello",6);
          goto LAB_00103056;
        }
        pcVar3 = "unexpected dictionary";
        sStack_a0 = 0x15;
LAB_001030cd:
        fwrite(pcVar3,sStack_a0,1,_stderr);
        goto LAB_001030d6;
      }
      if (uVar1 == 1) {
        uVar1 = inflateEnd(&local_90);
        if (uVar1 == 0) {
          iVar2 = strcmp((char *)uncompr,hello);
          if (iVar2 == 0) {
            printf("inflate with dictionary: %s\n",uncompr);
            return;
          }
          pcVar3 = "bad inflate with dict\n";
          sStack_a0 = 0x16;
          goto LAB_001030cd;
        }
        pcVar3 = "inflateEnd";
        goto LAB_00103072;
      }
LAB_00103056:
    } while (uVar1 == 0);
    pcVar3 = "inflate with dict";
  }
  else {
    pcVar3 = "inflateInit";
  }
LAB_00103072:
  fprintf(_stderr,"%s error: %d\n",pcVar3,(ulong)uVar1);
LAB_001030d6:
  exit(1);
}

Assistant:

void test_dict_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = (uInt)comprLen;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    d_stream.next_out = uncompr;
    d_stream.avail_out = (uInt)uncomprLen;

    for (;;) {
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        if (err == Z_NEED_DICT) {
            if (d_stream.adler != dictId) {
                fprintf(stderr, "unexpected dictionary");
                exit(1);
            }
            err = inflateSetDictionary(&d_stream, (const Bytef*)dictionary,
                                       (int)sizeof(dictionary));
        }
        CHECK_ERR(err, "inflate with dict");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad inflate with dict\n");
        exit(1);
    } else {
        printf("inflate with dictionary: %s\n", (char *)uncompr);
    }
}